

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

string_view
google::protobuf::internal::TransparentSupport<std::__cxx11::string>::
ImplicitConvert<std::__cxx11::string_const&>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str)

{
  string_view sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str_local;
  string_view res;
  
  sVar1 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)str);
  return sVar1;
}

Assistant:

static absl::string_view ImplicitConvert(T&& str) {
    if constexpr (std::is_convertible<T, absl::string_view>::value) {
      absl::string_view res = str;
      return res;
    } else if constexpr (std::is_convertible<T, const std::string&>::value) {
      const std::string& ref = str;
      return ref;
    } else {
      return {str.data(), str.size()};
    }
  }